

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v11::detail::digit_grouping<char>::next(digit_grouping<char> *this,next_state *state)

{
  char cVar1;
  next_state *__lhs;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  reference pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  next_state *local_20;
  next_state *state_local;
  digit_grouping<char> *this_local;
  
  local_20 = state;
  state_local = (next_state *)this;
  uVar4 = std::__cxx11::string::empty();
  __lhs = local_20;
  if ((uVar4 & 1) == 0) {
    local_28._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator==(&__lhs->group,&local_28);
    if (bVar2) {
      pcVar5 = (char *)std::__cxx11::string::back();
      this_local._4_4_ = (int)*pcVar5 + local_20->pos;
      local_20->pos = this_local._4_4_;
    }
    else {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20->group);
      if ('\0' < *pcVar6) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20->group);
        cVar1 = *pcVar6;
        cVar3 = max_value<char>();
        if (cVar1 != cVar3) {
          local_30 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20->group,0);
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_30);
          local_20->pos = (int)*pcVar6 + local_20->pos;
          return local_20->pos;
        }
      }
      this_local._4_4_ = max_value<int>();
    }
  }
  else {
    this_local._4_4_ = max_value<int>();
  }
  return this_local._4_4_;
}

Assistant:

auto next(next_state& state) const -> int {
    if (thousands_sep_.empty()) return max_value<int>();
    if (state.group == grouping_.end()) return state.pos += grouping_.back();
    if (*state.group <= 0 || *state.group == max_value<char>())
      return max_value<int>();
    state.pos += *state.group++;
    return state.pos;
  }